

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

VarInfo * gola_findlabel(LexState *ls,GCstr *name)

{
  uint uVar1;
  VarInfo *pVVar2;
  
  uVar1 = ls->fs->bl->vstart;
  if (uVar1 < ls->vtop) {
    pVVar2 = ls->vstack + uVar1;
    do {
      if (((GCstr *)(pVVar2->name).gcptr64 == name) && ((pVVar2->info & 4) != 0)) {
        return pVVar2;
      }
      pVVar2 = pVVar2 + 1;
    } while (pVVar2 < ls->vstack + ls->vtop);
  }
  return (VarInfo *)0x0;
}

Assistant:

static VarInfo *gola_findlabel(LexState *ls, GCstr *name)
{
  VarInfo *v = ls->vstack + ls->fs->bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++)
    if (strref(v->name) == name && gola_islabel(v))
      return v;
  return NULL;
}